

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnExport
          (BinaryReaderInterp *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  long lVar3;
  pointer pFVar4;
  string_view name_local;
  ExportDesc local_c8;
  string local_98;
  Var local_78;
  
  name_local.size_ = name.size_;
  name_local.data_ = name.data_;
  local_c8.type.name.field_2._M_allocated_capacity._0_4_ = 0;
  local_c8.type.name.field_2._4_8_ = 0;
  local_c8.type.name._M_dataplus._M_p = (pointer)0x0;
  local_c8.type.name._M_string_length._0_4_ = 0;
  local_c8.type.name._M_string_length._4_4_ = 0;
  Var::Var(&local_78,item_index,(Location *)&local_c8);
  RVar2 = SharedValidator::OnExport
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     kind,&local_78,name);
  Var::~Var(&local_78);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  switch(kind) {
  case First:
    pFVar4 = (this->func_types_).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (ulong)item_index << 6;
    goto LAB_001b02c3;
  case Table:
    pFVar4 = (pointer)(this->table_types_).
                      super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    break;
  case Memory:
    pFVar4 = (pointer)(this->memory_types_).
                      super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    break;
  case Global:
    pFVar4 = (pointer)(this->global_types_).
                      super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (ulong)item_index * 0x18;
    goto LAB_001b02c3;
  case Event:
    pFVar4 = (pointer)(this->event_types_).
                      super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    break;
  default:
    local_c8.type.type._M_t.
    super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
    .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
            )(_Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
              )0x0;
    goto LAB_001b02d9;
  }
  lVar3 = (ulong)item_index * 0x28;
LAB_001b02c3:
  (**(code **)(*(long *)((long)&(pFVar4->super_ExternType)._vptr_ExternType + lVar3) + 0x10))
            (&local_c8,(long)&(pFVar4->super_ExternType)._vptr_ExternType + lVar3);
  local_c8.type.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )local_c8.type.name._M_dataplus._M_p;
LAB_001b02d9:
  pMVar1 = this->module_;
  string_view::to_string_abi_cxx11_(&local_98,&name_local);
  std::__cxx11::string::string((string *)&local_c8,(string *)&local_98);
  local_c8.index = item_index;
  std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
  emplace_back<wabt::interp::ExportDesc>(&pMVar1->exports,&local_c8);
  ExportType::~ExportType(&local_c8.type);
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result BinaryReaderInterp::OnExport(Index index,
                                    ExternalKind kind,
                                    Index item_index,
                                    string_view name) {
  CHECK_RESULT(validator_.OnExport(loc, kind, Var(item_index), name));

  std::unique_ptr<ExternType> type;
  switch (kind) {
    case ExternalKind::Func:   type = func_types_[item_index].Clone(); break;
    case ExternalKind::Table:  type = table_types_[item_index].Clone(); break;
    case ExternalKind::Memory: type = memory_types_[item_index].Clone(); break;
    case ExternalKind::Global: type = global_types_[item_index].Clone(); break;
    case ExternalKind::Event:  type = event_types_[item_index].Clone(); break;
  }
  module_.exports.push_back(
      ExportDesc{ExportType(name.to_string(), std::move(type)), item_index});
  return Result::Ok;
}